

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt __thiscall slang::SVInt::operator%(SVInt *this,SVInt *rhs)

{
  bool bVar1;
  SVInt *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  SVInt *in_RSI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar3;
  bool bothSigned;
  undefined8 in_stack_fffffffffffffed8;
  SVInt *in_stack_fffffffffffffee0;
  SVInt *in_stack_fffffffffffffef0;
  bitwidth_t bits;
  SVInt *in_stack_fffffffffffffef8;
  undefined1 *puVar4;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 uVar5;
  SVInt *in_stack_ffffffffffffff08;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 rhs_00;
  byte local_c9;
  undefined1 local_68 [23];
  uint8_t local_51;
  undefined7 in_stack_ffffffffffffffe0;
  
  local_c9 = 0;
  if (((in_RSI->super_SVIntStorage).signFlag & 1U) != 0) {
    local_c9 = (in_RDX->super_SVIntStorage).signFlag;
  }
  local_c9 = local_c9 & 1;
  if ((in_RSI->super_SVIntStorage).bitWidth == (in_RDX->super_SVIntStorage).bitWidth) {
    uVar5 = 1;
    if (((in_RSI->super_SVIntStorage).unknownFlag & 1U) == 0) {
      uVar5 = (in_RDX->super_SVIntStorage).unknownFlag;
    }
    puVar4 = local_68;
    rhs_00 = in_RDI;
    SVInt<int>(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    local_51 = (uint8_t)operator==(in_stack_ffffffffffffff08,
                                   (SVInt *)CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffff06,
                                                                    in_stack_ffffffffffffff00)));
    bVar1 = slang::operator||(false,(logic_t)0x0);
    ~SVInt(in_RDX);
    if (bVar1) {
      SVar3 = createFillX((bitwidth_t)((ulong)puVar4 >> 0x20),SUB81((ulong)puVar4 >> 0x18,0));
      uVar2 = SVar3.super_SVIntStorage._8_8_;
    }
    else {
      if ((local_c9 & 1) != 0) {
        bVar1 = isNegative(in_stack_fffffffffffffee0);
        if (bVar1) {
          bVar1 = isNegative(in_stack_fffffffffffffee0);
          if (bVar1) {
            operator-((SVInt *)in_RDI.pVal);
            operator-((SVInt *)in_RDI.pVal);
            urem(in_RSI,(SVInt *)rhs_00.pVal,SUB81((ulong)in_RDI >> 0x38,0));
            operator-((SVInt *)in_RDI.pVal);
            ~SVInt(in_RDX);
            ~SVInt(in_RDX);
            ~SVInt(in_RDX);
            uVar2 = extraout_RDX_01;
          }
          else {
            operator-((SVInt *)in_RDI.pVal);
            urem(in_RSI,(SVInt *)rhs_00.pVal,SUB81((ulong)in_RDI >> 0x38,0));
            operator-((SVInt *)in_RDI.pVal);
            ~SVInt(in_RDX);
            ~SVInt(in_RDX);
            uVar2 = extraout_RDX_02;
          }
          goto LAB_002a8914;
        }
        bVar1 = isNegative(in_stack_fffffffffffffee0);
        if (bVar1) {
          operator-((SVInt *)in_RDI.pVal);
          urem(in_RSI,(SVInt *)rhs_00.pVal,SUB81((ulong)in_RDI >> 0x38,0));
          ~SVInt(in_RDX);
          uVar2 = extraout_RDX_03;
          goto LAB_002a8914;
        }
      }
      SVar3 = urem(in_RSI,(SVInt *)rhs_00.pVal,SUB81((ulong)in_RDI >> 0x38,0));
      uVar2 = SVar3.super_SVIntStorage._8_8_;
    }
  }
  else {
    bVar1 = SUB81((ulong)in_stack_fffffffffffffef0 >> 0x18,0);
    bits = (bitwidth_t)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    if ((in_RSI->super_SVIntStorage).bitWidth < (in_RDX->super_SVIntStorage).bitWidth) {
      extend(in_stack_fffffffffffffef8,bits,bVar1);
      operator%(in_RDX,(SVInt *)CONCAT17(local_c9,in_stack_ffffffffffffffe0));
      ~SVInt(in_stack_fffffffffffffef0);
      uVar2 = extraout_RDX;
      rhs_00 = in_RDI;
    }
    else {
      extend(in_stack_fffffffffffffef8,bits,bVar1);
      operator%(in_RDX,(SVInt *)CONCAT17(local_c9,in_stack_ffffffffffffffe0));
      ~SVInt(in_stack_fffffffffffffef0);
      uVar2 = extraout_RDX_00;
      rhs_00 = in_RDI;
    }
  }
LAB_002a8914:
  SVar3.super_SVIntStorage.bitWidth = (int)uVar2;
  SVar3.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar2 >> 0x20);
  SVar3.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar2 >> 0x28);
  SVar3.super_SVIntStorage._14_2_ = (short)((ulong)uVar2 >> 0x30);
  SVar3.super_SVIntStorage.field_0.val = rhs_00.val;
  return (SVInt)SVar3.super_SVIntStorage;
}

Assistant:

SVInt SVInt::operator%(const SVInt& rhs) const {
    bool bothSigned = signFlag && rhs.signFlag;
    if (bitWidth != rhs.bitWidth) {
        if (bitWidth < rhs.bitWidth)
            return extend(rhs.bitWidth, bothSigned) % rhs;
        else
            return *this % rhs.extend(bitWidth, bothSigned);
    }

    // Any X's mean all X's; also dividing by zero does the same
    if (unknownFlag || rhs.unknownFlag || rhs == 0)
        return createFillX(bitWidth, bothSigned);

    // handle signed remainder
    if (bothSigned) {
        // do the remainder on positive numbers and flip the sign at the end
        if (isNegative()) {
            if (rhs.isNegative())
                return -urem(-(*this), -rhs, true);
            return -urem(-(*this), rhs, true);
        }
        if (rhs.isNegative())
            return urem(*this, -rhs, true);
    }

    // otherwise, just do the remainder
    return urem(*this, rhs, false);
}